

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O0

AST * parse_expression_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar1 == '\0') {
    translation_data_local = (Translation_Data *)parse_expression(translation_data,scope);
    cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
    if (cVar1 == '\0') {
      push_translation_error(" \';\' expected",translation_data);
      translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
    }
  }
  else {
    translation_data_local = (Translation_Data *)get_nop_tree();
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_expression_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST *hold;
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		hold=get_nop_tree();
		return (struct AST*)hold;
	}
	hold=parse_expression(translation_data,scope);
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		return hold;
	}else
	{
		push_translation_error(" ';' expected",translation_data);
		return (struct AST*)get_error_tree(hold);
	}
}